

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O0

uint aom_sad128x64_avx2(uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride)

{
  uint ref_stride_00;
  undefined4 in_ECX;
  long in_RDX;
  undefined4 in_ESI;
  uint32_t sum;
  uint half_width;
  int in_stack_ffffffffffffffdc;
  uint uVar1;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = 0x40;
  ref_stride_00 =
       sad64x64((uint8_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
                (uint8_t *)CONCAT44(in_ECX,0x40),in_stack_ffffffffffffffdc);
  uVar1 = sad64x64((uint8_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                   (int)(in_RDX + (ulong)uVar1 >> 0x20),(uint8_t *)CONCAT44(in_ECX,uVar1),
                   ref_stride_00);
  return uVar1 + ref_stride_00;
}

Assistant:

unsigned int aom_sad128x64_avx2(const uint8_t *src_ptr, int src_stride,
                                const uint8_t *ref_ptr, int ref_stride) {
  unsigned int half_width = 64;
  uint32_t sum = sad64x64(src_ptr, src_stride, ref_ptr, ref_stride);
  src_ptr += half_width;
  ref_ptr += half_width;
  sum += sad64x64(src_ptr, src_stride, ref_ptr, ref_stride);
  return sum;
}